

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O2

int disassemble_instr(u8 *data,char *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  char *__src;
  char hex [3] [3];
  char temp [80];
  
  bVar2 = *data;
  bVar1 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01"
          [bVar2];
  if (bVar1 == 1) {
    __src = "*INVALID*";
    if (s_opcode_mnemonic[bVar2] != (char *)0x0) {
      __src = s_opcode_mnemonic[bVar2];
    }
    strncpy(temp,__src,0x4f);
    hex[0][0] = ' ';
    hex[0][1] = ' ';
    hex[0][2] = '\0';
    hex[1][0] = ' ';
    hex[1][1] = ' ';
    hex[1][2] = '\0';
    hex[2][0] = ' ';
    hex[2][1] = ' ';
  }
  else {
    if (bVar1 == 3) {
      snprintf(temp,0x50,s_opcode_mnemonic[bVar2],(ulong)*(ushort *)(data + 1));
      hex[2][0] = "0123456789abcdef"[data[2] >> 4];
      hex[0][0] = ' ';
      hex[0][1] = ' ';
      hex[0][2] = '\0';
      hex[1][0] = ' ';
      hex[1][1] = ' ';
      hex[1][2] = '\0';
      hex[2][1] = "0123456789abcdef"[data[2] & 0xf];
    }
    else {
      if (bVar1 != 2) {
        __assert_fail("!\"invalid opcode byte length.\\n\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                      ,0x146,"int disassemble_instr(u8 *, char *, size_t)");
      }
      if (bVar2 == 0xcb) {
        strncpy(temp,s_cb_opcode_mnemonic[data[1]],0x4f);
      }
      else {
        snprintf(temp,0x50,s_opcode_mnemonic[bVar2],(ulong)data[1]);
      }
      hex[0][0] = ' ';
      hex[0][1] = ' ';
      hex[0][2] = '\0';
      hex[1][0] = ' ';
      hex[1][1] = ' ';
      hex[1][2] = '\0';
      hex[2][0] = ' ';
      hex[2][1] = ' ';
    }
    hex._0_8_ = (ulong)CONCAT32(hex._5_3_,
                                CONCAT11("0123456789abcdef"[data[1] & 0xf],
                                         "0123456789abcdef"[data[1] >> 4])) << 0x18;
    bVar2 = *data;
  }
  hex[2][2] = '\0';
  hex[0][1] = "0123456789abcdef"[bVar2 & 0xf];
  hex[0][0] = "0123456789abcdef"[bVar2 >> 4];
  snprintf(buffer,size,"%s %s %s  %-15s",hex,hex + 1,hex + 2,temp);
  return (uint)bVar1;
}

Assistant:

static int disassemble_instr(u8 data[3], char* buffer, size_t size) {
  char temp[80];
  u8 opcode = data[0];
  u8 num_bytes = s_opcode_bytes[opcode];
  switch (num_bytes) {
    case 1: {
      const char* mnemonic = s_opcode_mnemonic[opcode];
      if (!mnemonic) {
        mnemonic = "*INVALID*";
      }
      strncpy(temp, mnemonic, sizeof(temp) - 1);
      break;
    }
    case 2:
      if (opcode == 0xcb) {
        strncpy(temp, s_cb_opcode_mnemonic[data[1]], sizeof(temp) - 1);
      } else {
        snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode], data[1]);
      }
      break;
    case 3:
      snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode],
               (data[2] << 8) | data[1]);
      break;
    default: assert(!"invalid opcode byte length.\n"); break;
  }

  char hex[][3] = {"  ", "  ", "  "};
  switch (num_bytes) {
    case 3: sprint_hex(hex[2], data[2]); /* Fallthrough. */
    case 2: sprint_hex(hex[1], data[1]); /* Fallthrough. */
    case 1: sprint_hex(hex[0], data[0]); break;
  }

  snprintf(buffer, size, "%s %s %s  %-15s", hex[0], hex[1], hex[2], temp);
  return num_bytes;
}